

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O1

Timestamp * google::protobuf::operator-=(Timestamp *t,Duration *d)

{
  void *pvVar1;
  Timestamp local_38;
  
  util::anon_unknown_1::CreateNormalized<google::protobuf::Timestamp>
            (&local_38,t->seconds_ - d->seconds_,(long)t->nanos_ - (long)d->nanos_);
  pvVar1 = (t->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  if (((ulong)local_38.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    local_38.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(void **)((ulong)local_38.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                   0xfffffffffffffffe);
  }
  if (pvVar1 == local_38.super_Message.super_MessageLite._internal_metadata_.ptr_) {
    if (&local_38 != t) {
      Timestamp::InternalSwap(t,&local_38);
    }
  }
  else {
    Timestamp::CopyFrom(t,&local_38);
  }
  Timestamp::~Timestamp(&local_38);
  return t;
}

Assistant:

Timestamp& operator-=(Timestamp& t, const Duration& d) {  // NOLINT
  t = CreateNormalized<Timestamp>(t.seconds() - d.seconds(),
                                  t.nanos() - d.nanos());
  return t;
}